

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall
Analyser_containsExternalVariableByPointer_Test::TestBody
          (Analyser_containsExternalVariableByPointer_Test *this)

{
  char cVar1;
  char *pcVar2;
  allocator<char> local_ba;
  allocator<char> local_b9;
  AssertionResult gtest_ar;
  string local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  AnalyserPtr analyser;
  string local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  AssertionResult gtest_ar_;
  AnalyserExternalVariablePtr externalVariable;
  ModelPtr model;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",
             (allocator<char> *)&analyser);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",(unsigned_long *)&gtest_ar_,
             (unsigned_long *)&analyser);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&analyser,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x227,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&analyser,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&analyser);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Analyser::create();
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"membrane",&local_b9);
  libcellml::ComponentEntity::component
            (local_90,(bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._0_1_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"V",&local_ba);
  libcellml::Component::variable(local_70);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&externalVariable);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Analyser::addExternalVariable
            ((shared_ptr *)
             analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cVar1 = libcellml::Analyser::containsExternalVariable
                    ((shared_ptr *)
                     analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = (bool)cVar1;
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"analyser->containsExternalVariable(externalVariable)",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x22e,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cVar1 = libcellml::Analyser::containsExternalVariable
                    ((shared_ptr *)
                     analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,cVar1) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  if (cVar1 != '\0') {
    testing::Message::Message((Message *)local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"analyser->containsExternalVariable(nullptr)","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x22f,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&externalVariable.
              super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Analyser, containsExternalVariableByPointer)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();
    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    analyser->addExternalVariable(externalVariable);

    EXPECT_TRUE(analyser->containsExternalVariable(externalVariable));
    EXPECT_FALSE(analyser->containsExternalVariable(nullptr));
}